

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O0

int c1f5kb_(int *ido,int *l1,int *na,double *cc,int *in1,double *ch,int *in2,double *wa)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long in_RCX;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int *in_R8;
  long in_R9;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double cr3;
  double cr2;
  double di2;
  double di5;
  double di4;
  double di3;
  double ci5;
  double ci4;
  double ci3;
  double ci2;
  int k;
  int i__;
  int i__2;
  int i__1;
  int wa_offset;
  int wa_dim1;
  int ch_offset;
  int ch_dim2;
  int ch_dim1;
  int cc_offset;
  int cc_dim3;
  int cc_dim2;
  int cc_dim1;
  double ti12;
  double tr12;
  double ti11;
  double tr11;
  undefined4 local_8c;
  undefined4 local_88;
  double chold2;
  double chold1;
  double tr5;
  double tr4;
  double tr3;
  double tr2;
  double dr2;
  double dr5;
  double ti5;
  double ti4;
  double ti3;
  double ti2;
  double dr4;
  double dr3;
  double cr4;
  double cr5;
  
  iVar1 = *in_RDI;
  lVar9 = (long)di2 + (long)(iVar1 * 5 + 1) * -8;
  iVar2 = *in_R8;
  iVar3 = *in_RSI;
  iVar4 = *in_RDI;
  lVar10 = in_RCX + (long)(iVar2 * (iVar3 * (iVar4 + 1) + 1) + 1) * -8;
  iVar5 = *(int *)cr2;
  iVar6 = *in_RSI;
  lVar11 = in_R9 + (long)(iVar5 * (iVar6 * 6 + 1) + 1) * -8;
  if ((*in_RDI < 2) && (*in_RDX != 1)) {
    iVar1 = *in_RSI;
    for (local_8c = 1; local_8c <= iVar1; local_8c = local_8c + 1) {
      dVar16 = *(double *)(lVar10 + (long)((local_8c + (iVar4 * 2 + 1) * iVar3) * iVar2 + 2) * 8) -
               *(double *)(lVar10 + (long)((local_8c + (iVar4 * 5 + 1) * iVar3) * iVar2 + 2) * 8);
      dVar17 = *(double *)(lVar10 + (long)((local_8c + (iVar4 * 2 + 1) * iVar3) * iVar2 + 2) * 8) +
               *(double *)(lVar10 + (long)((local_8c + (iVar4 * 5 + 1) * iVar3) * iVar2 + 2) * 8);
      dVar18 = *(double *)(lVar10 + (long)((local_8c + (iVar4 * 3 + 1) * iVar3) * iVar2 + 2) * 8) -
               *(double *)(lVar10 + (long)((local_8c + (iVar4 * 4 + 1) * iVar3) * iVar2 + 2) * 8);
      dVar19 = *(double *)(lVar10 + (long)((local_8c + (iVar4 * 3 + 1) * iVar3) * iVar2 + 2) * 8) +
               *(double *)(lVar10 + (long)((local_8c + (iVar4 * 4 + 1) * iVar3) * iVar2 + 2) * 8);
      dVar20 = *(double *)(lVar10 + (long)((local_8c + (iVar4 * 2 + 1) * iVar3) * iVar2 + 1) * 8) -
               *(double *)(lVar10 + (long)((local_8c + (iVar4 * 5 + 1) * iVar3) * iVar2 + 1) * 8);
      dVar21 = *(double *)(lVar10 + (long)((local_8c + (iVar4 * 2 + 1) * iVar3) * iVar2 + 1) * 8) +
               *(double *)(lVar10 + (long)((local_8c + (iVar4 * 5 + 1) * iVar3) * iVar2 + 1) * 8);
      dVar22 = *(double *)(lVar10 + (long)((local_8c + (iVar4 * 3 + 1) * iVar3) * iVar2 + 1) * 8) -
               *(double *)(lVar10 + (long)((local_8c + (iVar4 * 4 + 1) * iVar3) * iVar2 + 1) * 8);
      dVar23 = *(double *)(lVar10 + (long)((local_8c + (iVar4 * 3 + 1) * iVar3) * iVar2 + 1) * 8) +
               *(double *)(lVar10 + (long)((local_8c + (iVar4 * 4 + 1) * iVar3) * iVar2 + 1) * 8);
      dVar15 = *(double *)(lVar10 + (long)((local_8c + (iVar4 + 1) * iVar3) * iVar2 + 2) * 8);
      dVar24 = dVar23 * -0.8090169943749475 +
               dVar21 * 0.3090169943749474 +
               *(double *)(lVar10 + (long)((local_8c + (iVar4 + 1) * iVar3) * iVar2 + 1) * 8);
      dVar12 = dVar19 * -0.8090169943749475 +
               dVar17 * 0.3090169943749474 +
               *(double *)(lVar10 + (long)((local_8c + (iVar4 + 1) * iVar3) * iVar2 + 2) * 8);
      dVar13 = dVar23 * 0.3090169943749474 +
               dVar21 * -0.8090169943749475 +
               *(double *)(lVar10 + (long)((local_8c + (iVar4 + 1) * iVar3) * iVar2 + 1) * 8);
      dVar14 = dVar19 * 0.3090169943749474 +
               dVar17 * -0.8090169943749475 +
               *(double *)(lVar10 + (long)((local_8c + (iVar4 + 1) * iVar3) * iVar2 + 2) * 8);
      *(double *)(lVar10 + (long)((local_8c + (iVar4 + 1) * iVar3) * iVar2 + 1) * 8) =
           *(double *)(lVar10 + (long)((local_8c + (iVar4 + 1) * iVar3) * iVar2 + 1) * 8) + dVar21 +
           dVar23;
      *(double *)(lVar10 + (long)((local_8c + (iVar4 + 1) * iVar3) * iVar2 + 2) * 8) =
           dVar15 + dVar17 + dVar19;
      dVar15 = dVar20 * 0.9510565162951536 + dVar22 * 0.5877852522924731;
      dVar17 = dVar16 * 0.9510565162951536 + dVar18 * 0.5877852522924731;
      dVar19 = dVar20 * 0.5877852522924731 + -(dVar22 * 0.9510565162951536);
      dVar16 = dVar16 * 0.5877852522924731 + -(dVar18 * 0.9510565162951536);
      *(double *)(lVar10 + (long)((local_8c + (iVar4 * 2 + 1) * iVar3) * iVar2 + 1) * 8) =
           dVar24 - dVar17;
      *(double *)(lVar10 + (long)((local_8c + (iVar4 * 5 + 1) * iVar3) * iVar2 + 1) * 8) =
           dVar24 + dVar17;
      *(double *)(lVar10 + (long)((local_8c + (iVar4 * 2 + 1) * iVar3) * iVar2 + 2) * 8) =
           dVar12 + dVar15;
      *(double *)(lVar10 + (long)((local_8c + (iVar4 * 3 + 1) * iVar3) * iVar2 + 2) * 8) =
           dVar14 + dVar19;
      *(double *)(lVar10 + (long)((local_8c + (iVar4 * 3 + 1) * iVar3) * iVar2 + 1) * 8) =
           dVar13 - dVar16;
      *(double *)(lVar10 + (long)((local_8c + (iVar4 * 4 + 1) * iVar3) * iVar2 + 1) * 8) =
           dVar13 + dVar16;
      *(double *)(lVar10 + (long)((local_8c + (iVar4 * 4 + 1) * iVar3) * iVar2 + 2) * 8) =
           dVar14 - dVar19;
      *(double *)(lVar10 + (long)((local_8c + (iVar4 * 5 + 1) * iVar3) * iVar2 + 2) * 8) =
           dVar12 - dVar15;
    }
  }
  else {
    iVar7 = *in_RSI;
    for (local_8c = 1; local_8c <= iVar7; local_8c = local_8c + 1) {
      dVar15 = *(double *)(lVar10 + (long)((local_8c + (iVar4 * 2 + 1) * iVar3) * iVar2 + 2) * 8) -
               *(double *)(lVar10 + (long)((local_8c + (iVar4 * 5 + 1) * iVar3) * iVar2 + 2) * 8);
      dVar16 = *(double *)(lVar10 + (long)((local_8c + (iVar4 * 2 + 1) * iVar3) * iVar2 + 2) * 8) +
               *(double *)(lVar10 + (long)((local_8c + (iVar4 * 5 + 1) * iVar3) * iVar2 + 2) * 8);
      dVar17 = *(double *)(lVar10 + (long)((local_8c + (iVar4 * 3 + 1) * iVar3) * iVar2 + 2) * 8) -
               *(double *)(lVar10 + (long)((local_8c + (iVar4 * 4 + 1) * iVar3) * iVar2 + 2) * 8);
      dVar18 = *(double *)(lVar10 + (long)((local_8c + (iVar4 * 3 + 1) * iVar3) * iVar2 + 2) * 8) +
               *(double *)(lVar10 + (long)((local_8c + (iVar4 * 4 + 1) * iVar3) * iVar2 + 2) * 8);
      dVar19 = *(double *)(lVar10 + (long)((local_8c + (iVar4 * 2 + 1) * iVar3) * iVar2 + 1) * 8) -
               *(double *)(lVar10 + (long)((local_8c + (iVar4 * 5 + 1) * iVar3) * iVar2 + 1) * 8);
      dVar20 = *(double *)(lVar10 + (long)((local_8c + (iVar4 * 2 + 1) * iVar3) * iVar2 + 1) * 8) +
               *(double *)(lVar10 + (long)((local_8c + (iVar4 * 5 + 1) * iVar3) * iVar2 + 1) * 8);
      dVar21 = *(double *)(lVar10 + (long)((local_8c + (iVar4 * 3 + 1) * iVar3) * iVar2 + 1) * 8) -
               *(double *)(lVar10 + (long)((local_8c + (iVar4 * 4 + 1) * iVar3) * iVar2 + 1) * 8);
      dVar22 = *(double *)(lVar10 + (long)((local_8c + (iVar4 * 3 + 1) * iVar3) * iVar2 + 1) * 8) +
               *(double *)(lVar10 + (long)((local_8c + (iVar4 * 4 + 1) * iVar3) * iVar2 + 1) * 8);
      *(double *)(lVar11 + (long)((local_8c + iVar6 * 6) * iVar5 + 1) * 8) =
           *(double *)(lVar10 + (long)((local_8c + (iVar4 + 1) * iVar3) * iVar2 + 1) * 8) + dVar20 +
           dVar22;
      *(double *)(lVar11 + (long)((local_8c + iVar6 * 6) * iVar5 + 2) * 8) =
           *(double *)(lVar10 + (long)((local_8c + (iVar4 + 1) * iVar3) * iVar2 + 2) * 8) + dVar16 +
           dVar18;
      dVar23 = dVar22 * -0.8090169943749475 +
               dVar20 * 0.3090169943749474 +
               *(double *)(lVar10 + (long)((local_8c + (iVar4 + 1) * iVar3) * iVar2 + 1) * 8);
      dVar24 = dVar18 * -0.8090169943749475 +
               dVar16 * 0.3090169943749474 +
               *(double *)(lVar10 + (long)((local_8c + (iVar4 + 1) * iVar3) * iVar2 + 2) * 8);
      dVar20 = dVar22 * 0.3090169943749474 +
               dVar20 * -0.8090169943749475 +
               *(double *)(lVar10 + (long)((local_8c + (iVar4 + 1) * iVar3) * iVar2 + 1) * 8);
      dVar16 = dVar18 * 0.3090169943749474 +
               dVar16 * -0.8090169943749475 +
               *(double *)(lVar10 + (long)((local_8c + (iVar4 + 1) * iVar3) * iVar2 + 2) * 8);
      dVar18 = dVar19 * 0.9510565162951536 + dVar21 * 0.5877852522924731;
      dVar22 = dVar15 * 0.9510565162951536 + dVar17 * 0.5877852522924731;
      dVar19 = dVar19 * 0.5877852522924731 + -(dVar21 * 0.9510565162951536);
      dVar15 = dVar15 * 0.5877852522924731 + -(dVar17 * 0.9510565162951536);
      *(double *)(lVar11 + (long)((local_8c + iVar6 * 7) * iVar5 + 1) * 8) = dVar23 - dVar22;
      *(double *)(lVar11 + (long)((local_8c + iVar6 * 10) * iVar5 + 1) * 8) = dVar23 + dVar22;
      *(double *)(lVar11 + (long)((local_8c + iVar6 * 7) * iVar5 + 2) * 8) = dVar24 + dVar18;
      *(double *)(lVar11 + (long)((local_8c + iVar6 * 8) * iVar5 + 2) * 8) = dVar16 + dVar19;
      *(double *)(lVar11 + (long)((local_8c + iVar6 * 8) * iVar5 + 1) * 8) = dVar20 - dVar15;
      *(double *)(lVar11 + (long)((local_8c + iVar6 * 9) * iVar5 + 1) * 8) = dVar20 + dVar15;
      *(double *)(lVar11 + (long)((local_8c + iVar6 * 9) * iVar5 + 2) * 8) = dVar16 - dVar19;
      *(double *)(lVar11 + (long)((local_8c + iVar6 * 10) * iVar5 + 2) * 8) = dVar24 - dVar18;
    }
    if (*in_RDI != 1) {
      iVar7 = *in_RDI;
      for (local_88 = 2; local_88 <= iVar7; local_88 = local_88 + 1) {
        iVar8 = *in_RSI;
        for (local_8c = 1; local_8c <= iVar8; local_8c = local_8c + 1) {
          dVar15 = *(double *)
                    (lVar10 + (long)((local_8c + (local_88 + iVar4 * 2) * iVar3) * iVar2 + 2) * 8) -
                   *(double *)
                    (lVar10 + (long)((local_8c + (local_88 + iVar4 * 5) * iVar3) * iVar2 + 2) * 8);
          dVar16 = *(double *)
                    (lVar10 + (long)((local_8c + (local_88 + iVar4 * 2) * iVar3) * iVar2 + 2) * 8) +
                   *(double *)
                    (lVar10 + (long)((local_8c + (local_88 + iVar4 * 5) * iVar3) * iVar2 + 2) * 8);
          dVar17 = *(double *)
                    (lVar10 + (long)((local_8c + (local_88 + iVar4 * 3) * iVar3) * iVar2 + 2) * 8) -
                   *(double *)
                    (lVar10 + (long)((local_8c + (local_88 + iVar4 * 4) * iVar3) * iVar2 + 2) * 8);
          dVar18 = *(double *)
                    (lVar10 + (long)((local_8c + (local_88 + iVar4 * 3) * iVar3) * iVar2 + 2) * 8) +
                   *(double *)
                    (lVar10 + (long)((local_8c + (local_88 + iVar4 * 4) * iVar3) * iVar2 + 2) * 8);
          dVar19 = *(double *)
                    (lVar10 + (long)((local_8c + (local_88 + iVar4 * 2) * iVar3) * iVar2 + 1) * 8) -
                   *(double *)
                    (lVar10 + (long)((local_8c + (local_88 + iVar4 * 5) * iVar3) * iVar2 + 1) * 8);
          dVar20 = *(double *)
                    (lVar10 + (long)((local_8c + (local_88 + iVar4 * 2) * iVar3) * iVar2 + 1) * 8) +
                   *(double *)
                    (lVar10 + (long)((local_8c + (local_88 + iVar4 * 5) * iVar3) * iVar2 + 1) * 8);
          dVar21 = *(double *)
                    (lVar10 + (long)((local_8c + (local_88 + iVar4 * 3) * iVar3) * iVar2 + 1) * 8) -
                   *(double *)
                    (lVar10 + (long)((local_8c + (local_88 + iVar4 * 4) * iVar3) * iVar2 + 1) * 8);
          dVar22 = *(double *)
                    (lVar10 + (long)((local_8c + (local_88 + iVar4 * 3) * iVar3) * iVar2 + 1) * 8) +
                   *(double *)
                    (lVar10 + (long)((local_8c + (local_88 + iVar4 * 4) * iVar3) * iVar2 + 1) * 8);
          *(double *)(lVar11 + (long)((local_8c + (local_88 * 5 + 1) * iVar6) * iVar5 + 1) * 8) =
               *(double *)(lVar10 + (long)((local_8c + (local_88 + iVar4) * iVar3) * iVar2 + 1) * 8)
               + dVar20 + dVar22;
          *(double *)(lVar11 + (long)((local_8c + (local_88 * 5 + 1) * iVar6) * iVar5 + 2) * 8) =
               *(double *)(lVar10 + (long)((local_8c + (local_88 + iVar4) * iVar3) * iVar2 + 2) * 8)
               + dVar16 + dVar18;
          dVar23 = dVar22 * -0.8090169943749475 +
                   dVar20 * 0.3090169943749474 +
                   *(double *)
                    (lVar10 + (long)((local_8c + (local_88 + iVar4) * iVar3) * iVar2 + 1) * 8);
          dVar24 = dVar18 * -0.8090169943749475 +
                   dVar16 * 0.3090169943749474 +
                   *(double *)
                    (lVar10 + (long)((local_8c + (local_88 + iVar4) * iVar3) * iVar2 + 2) * 8);
          dVar20 = dVar22 * 0.3090169943749474 +
                   dVar20 * -0.8090169943749475 +
                   *(double *)
                    (lVar10 + (long)((local_8c + (local_88 + iVar4) * iVar3) * iVar2 + 1) * 8);
          dVar22 = dVar18 * 0.3090169943749474 +
                   dVar16 * -0.8090169943749475 +
                   *(double *)
                    (lVar10 + (long)((local_8c + (local_88 + iVar4) * iVar3) * iVar2 + 2) * 8);
          dVar16 = dVar19 * 0.9510565162951536 + dVar21 * 0.5877852522924731;
          dVar18 = dVar15 * 0.9510565162951536 + dVar17 * 0.5877852522924731;
          dVar19 = dVar19 * 0.5877852522924731 + -(dVar21 * 0.9510565162951536);
          dVar15 = dVar15 * 0.5877852522924731 + -(dVar17 * 0.9510565162951536);
          dVar17 = dVar20 - dVar15;
          dVar20 = dVar20 + dVar15;
          dVar15 = dVar22 + dVar19;
          dVar22 = dVar22 - dVar19;
          dVar19 = dVar23 + dVar18;
          dVar23 = dVar23 - dVar18;
          dVar18 = dVar24 - dVar16;
          dVar24 = dVar24 + dVar16;
          *(double *)(lVar11 + (long)((local_8c + (local_88 * 5 + 2) * iVar6) * iVar5 + 1) * 8) =
               *(double *)(lVar9 + (long)(local_88 + iVar1 * 5) * 8) * dVar23 +
               -(*(double *)(lVar9 + (long)(local_88 + iVar1 * 9) * 8) * dVar24);
          *(double *)(lVar11 + (long)((local_8c + (local_88 * 5 + 2) * iVar6) * iVar5 + 2) * 8) =
               *(double *)(lVar9 + (long)(local_88 + iVar1 * 5) * 8) * dVar24 +
               *(double *)(lVar9 + (long)(local_88 + iVar1 * 9) * 8) * dVar23;
          *(double *)(lVar11 + (long)((local_8c + (local_88 * 5 + 3) * iVar6) * iVar5 + 1) * 8) =
               *(double *)(lVar9 + (long)(local_88 + iVar1 * 6) * 8) * dVar17 +
               -(*(double *)(lVar9 + (long)(local_88 + iVar1 * 10) * 8) * dVar15);
          *(double *)(lVar11 + (long)((local_8c + (local_88 * 5 + 3) * iVar6) * iVar5 + 2) * 8) =
               *(double *)(lVar9 + (long)(local_88 + iVar1 * 6) * 8) * dVar15 +
               *(double *)(lVar9 + (long)(local_88 + iVar1 * 10) * 8) * dVar17;
          *(double *)(lVar11 + (long)((local_8c + (local_88 * 5 + 4) * iVar6) * iVar5 + 1) * 8) =
               *(double *)(lVar9 + (long)(local_88 + iVar1 * 7) * 8) * dVar20 +
               -(*(double *)(lVar9 + (long)(local_88 + iVar1 * 0xb) * 8) * dVar22);
          *(double *)(lVar11 + (long)((local_8c + (local_88 * 5 + 4) * iVar6) * iVar5 + 2) * 8) =
               *(double *)(lVar9 + (long)(local_88 + iVar1 * 7) * 8) * dVar22 +
               *(double *)(lVar9 + (long)(local_88 + iVar1 * 0xb) * 8) * dVar20;
          *(double *)(lVar11 + (long)((local_8c + (local_88 * 5 + 5) * iVar6) * iVar5 + 1) * 8) =
               *(double *)(lVar9 + (long)(local_88 + iVar1 * 8) * 8) * dVar19 +
               -(*(double *)(lVar9 + (long)(local_88 + iVar1 * 0xc) * 8) * dVar18);
          *(double *)(lVar11 + (long)((local_8c + (local_88 * 5 + 5) * iVar6) * iVar5 + 2) * 8) =
               *(double *)(lVar9 + (long)(local_88 + iVar1 * 8) * 8) * dVar18 +
               *(double *)(lVar9 + (long)(local_88 + iVar1 * 0xc) * 8) * dVar19;
        }
      }
    }
  }
  return 0;
}

Assistant:

int c1f5kb_(int *ido, int *l1, int *na, fft_real_t *cc,
	 int *in1, fft_real_t *ch, int *in2, fft_real_t *wa)
{
    /* Initialized data */

     fft_real_t tr11 = .3090169943749474;
     fft_real_t ti11 = .9510565162951536;
     fft_real_t tr12 = -.8090169943749474;
     fft_real_t ti12 = .5877852522924731;

    /* System generated locals */
    int cc_dim1, cc_dim2, cc_dim3, cc_offset, ch_dim1, ch_dim2, ch_offset,
	     wa_dim1, wa_offset, i__1, i__2;

    /* Local variables */
     int i__, k;
     fft_real_t ci2, ci3, ci4, ci5, di3, di4, di5, di2, cr2, cr3, cr5, cr4,
	    dr3, dr4, ti2, ti3, ti4, ti5, dr5, dr2, tr2, tr3, tr4, tr5,
	    chold1, chold2;

    /* Parameter adjustments */
    wa_dim1 = *ido;
    wa_offset = 1 + wa_dim1 * 5;
    wa -= wa_offset;
    cc_dim1 = *in1;
    cc_dim2 = *l1;
    cc_dim3 = *ido;
    cc_offset = 1 + cc_dim1 * (1 + cc_dim2 * (1 + cc_dim3));
    cc -= cc_offset;
    ch_dim1 = *in2;
    ch_dim2 = *l1;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * 6);
    ch -= ch_offset;

    /* Function Body */

/* FFTPACK 5.1 auxiliary routine */

    if (*ido > 1 || *na == 1) {
	goto L102;
    }
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	ti5 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] - cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2];
	ti2 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] + cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2];
	ti4 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] - cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2];
	ti3 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] + cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2];
	tr5 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] - cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1];
	tr2 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] + cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1];
	tr4 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] - cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1];
	tr3 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] + cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1];
	chold1 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr2 + tr3;
	chold2 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + ti2 + ti3;
	cr2 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr11 * tr2 +
		tr12 * tr3;
	ci2 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + tr11 * ti2 +
		tr12 * ti3;
	cr3 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr12 * tr2 +
		tr11 * tr3;
	ci3 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + tr12 * ti2 +
		tr11 * ti3;
	cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] = chold1;
	cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] = chold2;
	cr5 = ti11 * tr5 + ti12 * tr4;
	ci5 = ti11 * ti5 + ti12 * ti4;
	cr4 = ti12 * tr5 - ti11 * tr4;
	ci4 = ti12 * ti5 - ti11 * ti4;
	cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] = cr2 - ci5;
	cc[(k + (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1] = cr2 + ci5;
	cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] = ci2 + cr5;
	cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] = ci3 + cr4;
	cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] = cr3 - ci4;
	cc[(k + ((cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1] = cr3 + ci4;
	cc[(k + ((cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2] = ci3 - cr4;
	cc[(k + (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2] = ci2 - cr5;
/* L101: */
    }
    return 0;
L102:
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	ti5 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] - cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2];
	ti2 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] + cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2];
	ti4 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] - cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2];
	ti3 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] + cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2];
	tr5 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] - cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1];
	tr2 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] + cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1];
	tr4 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] - cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1];
	tr3 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] + cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1];
	ch[(k + ch_dim2 * 6) * ch_dim1 + 1] = cc[(k + (cc_dim3 + 1) * cc_dim2)
		 * cc_dim1 + 1] + tr2 + tr3;
	ch[(k + ch_dim2 * 6) * ch_dim1 + 2] = cc[(k + (cc_dim3 + 1) * cc_dim2)
		 * cc_dim1 + 2] + ti2 + ti3;
	cr2 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr11 * tr2 +
		tr12 * tr3;
	ci2 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + tr11 * ti2 +
		tr12 * ti3;
	cr3 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr12 * tr2 +
		tr11 * tr3;
	ci3 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + tr12 * ti2 +
		tr11 * ti3;
	cr5 = ti11 * tr5 + ti12 * tr4;
	ci5 = ti11 * ti5 + ti12 * ti4;
	cr4 = ti12 * tr5 - ti11 * tr4;
	ci4 = ti12 * ti5 - ti11 * ti4;
	ch[(k + ch_dim2 * 7) * ch_dim1 + 1] = cr2 - ci5;
	ch[(k + ch_dim2 * 10) * ch_dim1 + 1] = cr2 + ci5;
	ch[(k + ch_dim2 * 7) * ch_dim1 + 2] = ci2 + cr5;
	ch[(k + (ch_dim2 << 3)) * ch_dim1 + 2] = ci3 + cr4;
	ch[(k + (ch_dim2 << 3)) * ch_dim1 + 1] = cr3 - ci4;
	ch[(k + ch_dim2 * 9) * ch_dim1 + 1] = cr3 + ci4;
	ch[(k + ch_dim2 * 9) * ch_dim1 + 2] = ci3 - cr4;
	ch[(k + ch_dim2 * 10) * ch_dim1 + 2] = ci2 - cr5;
/* L103: */
    }
    if (*ido == 1) {
	return 0;
    }
    i__1 = *ido;
    for (i__ = 2; i__ <= i__1; ++i__) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    ti5 = cc[(k + (i__ + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 2] -
		    cc[(k + (i__ + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 2];
	    ti2 = cc[(k + (i__ + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 2] +
		    cc[(k + (i__ + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 2];
	    ti4 = cc[(k + (i__ + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 2] - cc[(
		    k + (i__ + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 2];
	    ti3 = cc[(k + (i__ + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 2] + cc[(
		    k + (i__ + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 2];
	    tr5 = cc[(k + (i__ + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] -
		    cc[(k + (i__ + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1];
	    tr2 = cc[(k + (i__ + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] +
		    cc[(k + (i__ + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1];
	    tr4 = cc[(k + (i__ + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] - cc[(
		    k + (i__ + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1];
	    tr3 = cc[(k + (i__ + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + cc[(
		    k + (i__ + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1];
	    ch[(k + (i__ * 5 + 1) * ch_dim2) * ch_dim1 + 1] = cc[(k + (i__ +
		    cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr2 + tr3;
	    ch[(k + (i__ * 5 + 1) * ch_dim2) * ch_dim1 + 2] = cc[(k + (i__ +
		    cc_dim3) * cc_dim2) * cc_dim1 + 2] + ti2 + ti3;
	    cr2 = cc[(k + (i__ + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr11 *
		    tr2 + tr12 * tr3;
	    ci2 = cc[(k + (i__ + cc_dim3) * cc_dim2) * cc_dim1 + 2] + tr11 *
		    ti2 + tr12 * ti3;
	    cr3 = cc[(k + (i__ + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr12 *
		    tr2 + tr11 * tr3;
	    ci3 = cc[(k + (i__ + cc_dim3) * cc_dim2) * cc_dim1 + 2] + tr12 *
		    ti2 + tr11 * ti3;
	    cr5 = ti11 * tr5 + ti12 * tr4;
	    ci5 = ti11 * ti5 + ti12 * ti4;
	    cr4 = ti12 * tr5 - ti11 * tr4;
	    ci4 = ti12 * ti5 - ti11 * ti4;
	    dr3 = cr3 - ci4;
	    dr4 = cr3 + ci4;
	    di3 = ci3 + cr4;
	    di4 = ci3 - cr4;
	    dr5 = cr2 + ci5;
	    dr2 = cr2 - ci5;
	    di5 = ci2 - cr5;
	    di2 = ci2 + cr5;
	    ch[(k + (i__ * 5 + 2) * ch_dim2) * ch_dim1 + 1] = wa[i__ +
		    wa_dim1 * 5] * dr2 - wa[i__ + wa_dim1 * 9] * di2;
	    ch[(k + (i__ * 5 + 2) * ch_dim2) * ch_dim1 + 2] = wa[i__ +
		    wa_dim1 * 5] * di2 + wa[i__ + wa_dim1 * 9] * dr2;
	    ch[(k + (i__ * 5 + 3) * ch_dim2) * ch_dim1 + 1] = wa[i__ +
		    wa_dim1 * 6] * dr3 - wa[i__ + wa_dim1 * 10] * di3;
	    ch[(k + (i__ * 5 + 3) * ch_dim2) * ch_dim1 + 2] = wa[i__ +
		    wa_dim1 * 6] * di3 + wa[i__ + wa_dim1 * 10] * dr3;
	    ch[(k + (i__ * 5 + 4) * ch_dim2) * ch_dim1 + 1] = wa[i__ +
		    wa_dim1 * 7] * dr4 - wa[i__ + wa_dim1 * 11] * di4;
	    ch[(k + (i__ * 5 + 4) * ch_dim2) * ch_dim1 + 2] = wa[i__ +
		    wa_dim1 * 7] * di4 + wa[i__ + wa_dim1 * 11] * dr4;
	    ch[(k + (i__ * 5 + 5) * ch_dim2) * ch_dim1 + 1] = wa[i__ + (
		    wa_dim1 << 3)] * dr5 - wa[i__ + wa_dim1 * 12] * di5;
	    ch[(k + (i__ * 5 + 5) * ch_dim2) * ch_dim1 + 2] = wa[i__ + (
		    wa_dim1 << 3)] * di5 + wa[i__ + wa_dim1 * 12] * dr5;
/* L104: */
	}
/* L105: */
    }
    return 0;
}